

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muxinternal.c
# Opt level: O2

WebPMuxError MuxValidate(WebPMux *mux)

{
  WebPMuxImage *pWVar1;
  WebPMuxError WVar2;
  int iVar3;
  WebPMuxError WVar4;
  WebPMuxError WVar5;
  uint32_t flags;
  int num_alpha;
  int num_images;
  int num_vp8x;
  int num_frames;
  int num_anim;
  int num_xmp;
  int num_exif;
  int num_iccp;
  
  WVar4 = WEBP_MUX_INVALID_ARGUMENT;
  WVar2 = WVar4;
  if (((((mux != (WebPMux *)0x0) && (mux->images != (WebPMuxImage *)0x0)) &&
       (WVar2 = WebPMuxGetFeatures(mux,&flags), WVar2 == WEBP_MUX_OK)) &&
      ((WVar2 = ValidateChunk(mux,IDX_ICCP,ICCP_FLAG,flags,1,&num_iccp), WVar2 == WEBP_MUX_OK &&
       (WVar2 = ValidateChunk(mux,IDX_EXIF,EXIF_FLAG,flags,1,&num_exif), WVar2 == WEBP_MUX_OK)))) &&
     ((WVar2 = ValidateChunk(mux,IDX_XMP,XMP_FLAG,flags,1,&num_xmp), WVar2 == WEBP_MUX_OK &&
      ((WVar2 = ValidateChunk(mux,IDX_ANIM,0,flags,1,&num_anim), WVar2 == WEBP_MUX_OK &&
       (WVar2 = WebPMuxNumChunks(mux,WEBP_CHUNK_ANMF,&num_frames), WVar2 == WEBP_MUX_OK)))))) {
    if ((flags & 2) == 0) {
      if (0 < num_frames || num_anim == 1) {
        return WEBP_MUX_INVALID_ARGUMENT;
      }
      pWVar1 = mux->images;
      if (pWVar1 == (WebPMuxImage *)0x0) {
        return WEBP_MUX_INVALID_ARGUMENT;
      }
      if (pWVar1->next != (WebPMuxImage *)0x0) {
        return WEBP_MUX_INVALID_ARGUMENT;
      }
      if (0 < mux->canvas_width) {
        if (pWVar1->width != mux->canvas_width) {
          return WEBP_MUX_INVALID_ARGUMENT;
        }
        if (pWVar1->height != mux->canvas_height) {
          return WEBP_MUX_INVALID_ARGUMENT;
        }
      }
    }
    else if (num_frames == 0 || num_anim == 0) {
      return WEBP_MUX_INVALID_ARGUMENT;
    }
    WVar5 = WEBP_MUX_OK;
    WVar2 = ValidateChunk(mux,IDX_VP8X,0,flags,1,&num_vp8x);
    if ((((WVar2 == WEBP_MUX_OK) &&
         (WVar2 = WebPMuxNumChunks(mux,WEBP_CHUNK_IMAGE,&num_images), WVar2 == WEBP_MUX_OK)) &&
        ((num_vp8x != 0 || (WVar2 = WVar4, num_images == 1)))) &&
       (iVar3 = MuxHasAlpha(mux->images), WVar2 = WVar5, iVar3 != 0)) {
      if (num_vp8x < 1) {
        WVar4 = WebPMuxNumChunks(mux,WEBP_CHUNK_ALPHA,&num_alpha);
        if (WVar4 != WEBP_MUX_OK) {
          return WVar4;
        }
        if (0 < num_alpha) {
          return WEBP_MUX_INVALID_ARGUMENT;
        }
      }
      else if ((flags & 0x10) == 0) {
        return WEBP_MUX_INVALID_ARGUMENT;
      }
    }
  }
  return WVar2;
}

Assistant:

WebPMuxError MuxValidate(const WebPMux* const mux) {
  int num_iccp;
  int num_exif;
  int num_xmp;
  int num_anim;
  int num_frames;
  int num_vp8x;
  int num_images;
  int num_alpha;
  uint32_t flags;
  WebPMuxError err;

  // Verify mux is not NULL.
  if (mux == NULL) return WEBP_MUX_INVALID_ARGUMENT;

  // Verify mux has at least one image.
  if (mux->images == NULL) return WEBP_MUX_INVALID_ARGUMENT;

  err = WebPMuxGetFeatures(mux, &flags);
  if (err != WEBP_MUX_OK) return err;

  // At most one color profile chunk.
  err = ValidateChunk(mux, IDX_ICCP, ICCP_FLAG, flags, 1, &num_iccp);
  if (err != WEBP_MUX_OK) return err;

  // At most one EXIF metadata.
  err = ValidateChunk(mux, IDX_EXIF, EXIF_FLAG, flags, 1, &num_exif);
  if (err != WEBP_MUX_OK) return err;

  // At most one XMP metadata.
  err = ValidateChunk(mux, IDX_XMP, XMP_FLAG, flags, 1, &num_xmp);
  if (err != WEBP_MUX_OK) return err;

  // Animation: ANIMATION_FLAG, ANIM chunk and ANMF chunk(s) are consistent.
  // At most one ANIM chunk.
  err = ValidateChunk(mux, IDX_ANIM, NO_FLAG, flags, 1, &num_anim);
  if (err != WEBP_MUX_OK) return err;
  err = ValidateChunk(mux, IDX_ANMF, NO_FLAG, flags, -1, &num_frames);
  if (err != WEBP_MUX_OK) return err;

  {
    const int has_animation = !!(flags & ANIMATION_FLAG);
    if (has_animation && (num_anim == 0 || num_frames == 0)) {
      return WEBP_MUX_INVALID_ARGUMENT;
    }
    if (!has_animation && (num_anim == 1 || num_frames > 0)) {
      return WEBP_MUX_INVALID_ARGUMENT;
    }
    if (!has_animation) {
      const WebPMuxImage* images = mux->images;
      // There can be only one image.
      if (images == NULL || images->next != NULL) {
        return WEBP_MUX_INVALID_ARGUMENT;
      }
      // Size must match.
      if (mux->canvas_width > 0) {
        if (images->width != mux->canvas_width ||
            images->height != mux->canvas_height) {
          return WEBP_MUX_INVALID_ARGUMENT;
        }
      }
    }
  }

  // Verify either VP8X chunk is present OR there is only one elem in
  // mux->images.
  err = ValidateChunk(mux, IDX_VP8X, NO_FLAG, flags, 1, &num_vp8x);
  if (err != WEBP_MUX_OK) return err;
  err = ValidateChunk(mux, IDX_VP8, NO_FLAG, flags, -1, &num_images);
  if (err != WEBP_MUX_OK) return err;
  if (num_vp8x == 0 && num_images != 1) return WEBP_MUX_INVALID_ARGUMENT;

  // ALPHA_FLAG & alpha chunk(s) are consistent.
  // Note: ALPHA_FLAG can be set when there is actually no Alpha data present.
  if (MuxHasAlpha(mux->images)) {
    if (num_vp8x > 0) {
      // VP8X chunk is present, so it should contain ALPHA_FLAG.
      if (!(flags & ALPHA_FLAG)) return WEBP_MUX_INVALID_ARGUMENT;
    } else {
      // VP8X chunk is not present, so ALPH chunks should NOT be present either.
      err = WebPMuxNumChunks(mux, WEBP_CHUNK_ALPHA, &num_alpha);
      if (err != WEBP_MUX_OK) return err;
      if (num_alpha > 0) return WEBP_MUX_INVALID_ARGUMENT;
    }
  }

  return WEBP_MUX_OK;
}